

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O2

BaseExc * __thiscall Iex_2_5::BaseExc::append(BaseExc *this,stringstream *s)

{
  string asStack_38 [32];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)&this->_message);
  std::__cxx11::string::~string(asStack_38);
  return this;
}

Assistant:

BaseExc &
BaseExc::append (std::stringstream &s)
{
    _message.append (s.str());
    return *this;
}